

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

bool __thiscall DOMTest::testCDATASection(DOMTest *this,DOMDocument *document)

{
  bool bVar1;
  int iVar2;
  DOMOperationType DVar3;
  long *plVar4;
  DOMNode *pDVar5;
  XMLCh *pXVar6;
  wchar16 *pwVar7;
  wchar16 *pwVar8;
  long lVar9;
  DOMDocument *pDVar10;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  DOMDocument *pDVar13;
  DOMNode *pDVar14;
  DOMNode *pDVar15;
  DOMNode *pDVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  DOMDocument *local_c8;
  DOMException *e;
  DOMNode *myimport;
  DOMNode *mycloned;
  void *myNull2;
  void *mydocument2;
  void *myNull;
  void *mySecond2;
  void *mySecond;
  void *myFirst2;
  void *myFirst;
  void *mydocument;
  XMLCh *userSecond;
  DOMCDATASection *userFirst;
  DOMCDATASection *userTest;
  bool OK;
  bool T;
  DOMNode *node2;
  DOMNode *node;
  DOMDocument *document_local;
  DOMTest *this_local;
  
  bVar1 = true;
  xercesc_4_0::XMLString::transcode
            ("dBodyLevel23",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)(**(code **)(*(long *)document + 0x68))();
  plVar4 = (long *)(**(code **)(*plVar4 + 0x158))(plVar4,tempStr);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x10))(plVar4,0);
  auVar18 = (**(code **)(*plVar4 + 0x38))();
  pDVar5 = auVar18._0_8_;
  pXVar6 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1,auVar18._8_8_,1);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x10))();
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x10))();
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
  if (((iVar2 == 0) && (lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))(), lVar9 != 0)) &&
     (lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(), lVar9 != 0)) {
    pwVar7 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x18))();
    pwVar8 = (wchar16 *)(**(code **)(*(long *)pXVar6 + 0x18))();
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar7,pwVar8);
    if (iVar2 == 0) goto LAB_0010d627;
  }
  else {
    lVar9 = (**(code **)(*(long *)pDVar5 + 0x18))();
    if ((lVar9 == 0) && (lVar9 = (**(code **)(*(long *)pXVar6 + 0x18))(), lVar9 == 0))
    goto LAB_0010d627;
  }
  fprintf(_stderr,"\'cloneNode\' did not clone the DOMCDATASection* node correctly\n");
  bVar1 = false;
LAB_0010d627:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,0);
  pDVar10 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (document != pDVar10) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x60a);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,pXVar6,0);
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar6 != pXVar11) {
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x611);
    bVar1 = false;
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,tempStr2,0);
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar12 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x619);
    bVar1 = false;
  }
  if (pXVar6 != pXVar11) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x61d);
    bVar1 = false;
  }
  if (pXVar6 == pXVar12) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x621);
    bVar1 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr3);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x629);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pXVar6 + 0xf0))(pXVar6,tempStr);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x62f);
    bVar1 = false;
  }
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar11 != tempStr2) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x637);
    bVar1 = false;
  }
  if (lVar9 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x63b);
    bVar1 = false;
  }
  pDVar13 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,0);
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar10 != pDVar13) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x642);
    bVar1 = false;
  }
  if (lVar9 != 0) {
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x646);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x64c);
    bVar1 = false;
  }
  lVar9 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (lVar9 != 0) {
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x650);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,&userhandler);
  pDVar14 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_CLONED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x658)
    ;
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x658);
    bVar1 = false;
  }
  pDVar10 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar10 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x658);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar15 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x658);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar15 != pDVar14) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x658);
    bVar1 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar15 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar5,1);
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_IMPORTED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x65d)
    ;
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x65d);
    bVar1 = false;
  }
  pDVar10 = (DOMDocument *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar10 != document) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x65d);
    bVar1 = false;
  }
  pDVar16 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar16 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x65d);
    bVar1 = false;
  }
  pDVar16 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar16 != pDVar15) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x65d);
    bVar1 = false;
  }
  (**(code **)(*(long *)pDVar15 + 0xe8))(pDVar15,tempStr2,pDVar5,&userhandler);
  (**(code **)(*(long *)pDVar15 + 0x138))();
  DVar3 = myUserDataHandler::getCurrentType(&userhandler);
  if (DVar3 != NODE_DELETED) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x662)
    ;
    bVar1 = false;
  }
  pXVar11 = myUserDataHandler::getCurrentKey(&userhandler);
  iVar2 = xercesc_4_0::XMLString::compareString(pXVar11,tempStr2);
  if (iVar2 != 0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x662);
    bVar1 = false;
  }
  pDVar15 = (DOMNode *)myUserDataHandler::getCurrentData(&userhandler);
  if (pDVar15 != pDVar5) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x662);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentSrc(&userhandler);
  if (pDVar15 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x662);
    bVar1 = false;
  }
  pDVar15 = myUserDataHandler::getCurrentDst(&userhandler);
  if (pDVar15 != (DOMNode *)0x0) {
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x662);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x666);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pXVar6);
  if ((uVar17 & 1) != 0) {
    fprintf(_stderr,"isSameNode failed in line %i\n",0x66a);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar14);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x670);
    bVar1 = false;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if ((uVar17 & 1) == 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x675);
    bVar1 = false;
  }
  local_c8 = (DOMDocument *)0x0;
  if (document != (DOMDocument *)0x0) {
    local_c8 = document + 0x18;
  }
  uVar17 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,local_c8);
  if ((uVar17 & 1) != 0) {
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x679);
    bVar1 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar5,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xcc);
  if (bVar1 == false) {
    printf(
          "\n*****The DOMCDATASection* method calls listed above failed, all others worked correctly.*****\n"
          );
  }
  return bVar1;
}

Assistant:

bool DOMTest::testCDATASection(DOMDocument* document)
{
    DOMNode* node;
    DOMNode* node2;
    bool T = true;
    bool OK = true;
// For debugging*****   printf("\n          testCDATASection's outputs:\n");
    XMLString::transcode("dBodyLevel23", tempStr, 3999);
    node = document->getDocumentElement()->getElementsByTagName(tempStr)->item(0)->getFirstChild(); // node gets DOMCDATASection* node

    node2 = node->cloneNode(T);//*****?

    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMCDATASection* node correctly\n");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument


    // Test the user data
    // Test simple set and get
    DOMCDATASection* userTest = (DOMCDATASection*) node;
    DOMCDATASection*  userFirst = (DOMCDATASection*) node2;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(document)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 204 );

    if (! OK)
        printf("\n*****The DOMCDATASection* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}